

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-driver.c
# Opt level: O1

ztast_t * ztast_from_file(char *filename,char *errbuf)

{
  int iVar1;
  ztlex_t *lex;
  void *p;
  ztslaballoc_t *opaque;
  ztast_t *pzVar2;
  ztlextok_t token;
  ztlexinf_t *info;
  ztparseinfo_t parseinfo;
  int local_44;
  ztlexinf_t *local_40;
  ztparseinfo_t local_38;
  
  *errbuf = '\0';
  lex = ztlex_from_file(lexer_malloc,lexer_free,filename);
  if (lex != (ztlex_t *)0x0) {
    p = ztparseAlloc(parser_malloc,&local_38);
    opaque = ztslaballoc_create();
    if (opaque != (ztslaballoc_t *)0x0) {
      pzVar2 = ztast_create(ztslaballoc,ztslabfree,opaque,ztparser_log);
      if (pzVar2 != (ztast_t *)0x0) {
        local_38.ast = pzVar2;
        local_38.errbuf = errbuf;
        do {
          iVar1 = ztlex_next_token(lex,&local_44,&local_40);
          if (iVar1 == 0) {
            ztparse(p,0,local_40);
            break;
          }
          ztparse(p,local_44,local_40);
        } while (*local_38.errbuf == '\0');
      }
      ztparseFree(p,parser_free);
      ztlex_destroy(lex);
      if (*local_38.errbuf != '\0') {
        return (ztast_t *)0x0;
      }
      return pzVar2;
    }
    ztparseFree(p,parser_free);
  }
  return (ztast_t *)0x0;
}

Assistant:

ztast_t *ztast_from_file(const char *filename, char errbuf[ZTMAXERRBUF])
{
  ztlex_t          *lexer;
  ztparseinfo_t     parseinfo;
  void             *parser;
  ztslaballoc_t    *slaballoc;
  ztast_t          *ast;
  ztlextok_t        token;
  const ztlexinf_t *info;

  errbuf[0] = '\0';

  /* Build a lexer */
  lexer = ztlex_from_file(lexer_malloc, lexer_free, filename);
  if (lexer == NULL)
    return NULL;

  /* Allocate a parser */
  parser = ztparseAlloc(parser_malloc, &parseinfo);

  /* Create a memory allocator */
  slaballoc = ztslaballoc_create();
  if (slaballoc == NULL)
  {
    ztparseFree(parser, parser_free);
    return NULL;
  }

  /* Create an AST */
  ast = ztast_create(ztslaballoc, ztslabfree, slaballoc, ztparser_log);
  if (ast == NULL)
    goto stop;

  /* Setup parser */
  parseinfo.ast    = ast;
  parseinfo.errbuf = errbuf;

  /* Uncomment to enable parser debug output */
  /* ztparseTrace(stderr, "ztparse: "); */

  /* Feed the parser one token at a time */
  while (ztlex_next_token(lexer, &token, &info))
  {
    ztparse(parser, token, (ztlexinf_t *) info); /* cast away const for interface */
    if (parseinfo.errbuf[0])
      goto stop;
  }
  ztparse(parser, 0, (ztlexinf_t *) info);

stop:
  ztparseFree(parser, parser_free);
#ifdef ZT_DEBUG
  ztslaballoc_spew(slaballoc);
#endif
  ztlex_destroy(lexer);

  return (parseinfo.errbuf[0] == '\0') ? ast : NULL;
}